

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

QString * __thiscall QFont::toString(QFont *this)

{
  bool bVar1;
  int iVar2;
  StyleHint SVar3;
  Weight WVar4;
  Style SVar5;
  Capitalization CVar6;
  SpacingType SVar7;
  StyleStrategy SVar8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  *in_RDI;
  long in_FS_OFFSET;
  qreal qVar9;
  QStringBuilder<const_QChar_&,_QString_&> QVar10;
  QString *fontDescription;
  QString fontStyle;
  QChar comma;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  *in_stack_ffffffffffffdea8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  *a;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  *b;
  undefined1 local_20f8 [24];
  undefined1 local_20e0 [24];
  undefined1 local_20c8 [24];
  undefined1 local_20b0 [24];
  undefined1 local_2098 [24];
  undefined1 local_2080 [24];
  undefined1 local_2068 [24];
  undefined1 local_2050 [24];
  undefined1 local_2038 [24];
  undefined1 local_2020 [24];
  undefined1 local_2008 [24];
  undefined1 local_1ff0 [24];
  undefined1 local_1fd8 [24];
  undefined1 local_1fc0 [24];
  undefined1 local_1fa8 [8094];
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a.ucs = L'ꪪ';
  a = in_RDI;
  b = in_RDI;
  QChar::QChar<char16_t,_true>(&local_a,L',');
  *(undefined1 **)&(a->a).a.a.a.a.a.a = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(a->a).a.a.a.a.a.a + 8) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(a->a).a.a.a.a.a.a + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  family((QFont *)a);
  ::operator+((QString *)a,(QChar *)in_RDI);
  qVar9 = pointSizeF((QFont *)0x7145d1);
  QString::number(qVar9,(char)local_1fa8,0x67);
  ::operator+((QStringBuilder<QString,_const_QChar_&> *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString> *)a,(QChar *)in_RDI);
  iVar2 = pixelSize((QFont *)0x71462c);
  QString::number((int)local_1fc0,iVar2);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  SVar3 = styleHint((QFont *)0x714684);
  QString::number((int)local_1fd8,SVar3);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  WVar4 = weight((QFont *)0x7146dc);
  QString::number((int)local_1ff0,WVar4);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  SVar5 = style((QFont *)0x714734);
  QString::number((int)local_2008,SVar5);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  bVar1 = underline((QFont *)0x71478c);
  QString::number((int)local_2020,(uint)bVar1);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  bVar1 = strikeOut((QFont *)0x7147e7);
  QString::number((int)local_2038,(uint)bVar1);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  bVar1 = fixedPitch((QFont *)0x714842);
  QString::number((int)local_2050,(uint)bVar1);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  QString::number((int)local_2068,0);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  CVar6 = capitalization((QFont *)0x7148eb);
  QString::number((int)local_2080,CVar6);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  SVar7 = letterSpacingType((QFont *)0x714943);
  QString::number((int)local_2098,SVar7);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  qVar9 = letterSpacing((QFont *)0x71499b);
  QString::number(qVar9,(char)local_20b0,0x67);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  qVar9 = wordSpacing((QFont *)0x7149f6);
  QString::number(qVar9,(char)local_20c8,0x67);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  iVar2 = stretch((QFont *)0x714a51);
  QString::number((int)local_20e0,iVar2);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
               *)a,(QString *)in_RDI);
  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
               *)a,(QChar *)in_RDI);
  SVar8 = styleStrategy((QFont *)0x714aa3);
  QString::number((int)local_20f8,SVar8);
  ::operator+(&a->a,(QString *)in_RDI);
  ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffdea8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(in_RDI);
  QString::~QString((QString *)0x714af7);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714b04);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714b1b);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714b28);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714b42);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714b4f);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714b69);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714b76);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714b90);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714b9d);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714bb7);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714bc4);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714bde);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714beb);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714c05);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714c12);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714c2c);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714c39);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714c53);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714c60);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714c7a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714c87);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714ca1);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714cae);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714cc8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
                     *)0x714cd5);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                     *)in_RDI);
  QString::~QString((QString *)0x714cef);
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>::
  ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>
                   *)0x714cfc);
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString> *)in_RDI);
  QString::~QString((QString *)0x714d16);
  QStringBuilder<QString,_const_QChar_&>::~QStringBuilder
            ((QStringBuilder<QString,_const_QChar_&> *)0x714d23);
  QString::~QString((QString *)0x714d30);
  styleName((QFont *)a);
  bVar1 = QString::isEmpty((QString *)0x714d6d);
  if (!bVar1) {
    QVar10 = ::operator+((QChar *)in_RDI,(QString *)in_stack_ffffffffffffdea8);
    ::operator+=((QString *)QVar10.a,(QStringBuilder<const_QChar_&,_QString_&> *)b);
  }
  QString::~QString((QString *)0x714dab);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString QFont::toString() const
{
    const QChar comma(u',');
    QString fontDescription = family() + comma +
        QString::number(     pointSizeF()) + comma +
        QString::number(      pixelSize()) + comma +
        QString::number((int) styleHint()) + comma +
        QString::number(         weight()) + comma +
        QString::number((int)     style()) + comma +
        QString::number((int) underline()) + comma +
        QString::number((int) strikeOut()) + comma +
        QString::number((int)fixedPitch()) + comma +
        QString::number((int)   false) + comma +
        QString::number((int)capitalization()) + comma +
        QString::number((int)letterSpacingType()) + comma +
        QString::number(letterSpacing()) + comma +
        QString::number(wordSpacing()) + comma +
        QString::number(stretch()) + comma +
        QString::number((int)styleStrategy());

    QString fontStyle = styleName();
    if (!fontStyle.isEmpty())
        fontDescription += comma + fontStyle;

    return fontDescription;
}